

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void polyscope::view::updateFlight(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  tdualquat<float,_(glm::qualifier)0> *x;
  tdualquat<float,_(glm::qualifier)0> *x_00;
  float *in_R8;
  float fVar3;
  double dVar4;
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  undefined1 auVar7 [16];
  vec<3,_float,_(glm::qualifier)0> vVar8;
  float tSmooth;
  dualquat interpR;
  undefined1 local_bc [12];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_b0;
  mat<3,_4,_float,_(glm::qualifier)0> local_a8;
  tdualquat<float,_(glm::qualifier)0> local_78;
  mat4 local_58;
  
  if (midflight == '\x01') {
    dVar4 = ImGui::GetTime();
    if (dVar4 <= (double)flightEndTime) {
      dVar4 = ImGui::GetTime();
      dVar4 = (dVar4 - (double)flightStartTime) / (double)(flightEndTime - flightStartTime);
      auVar7._0_4_ = (float)dVar4;
      auVar7._4_4_ = (int)((ulong)dVar4 >> 0x20);
      auVar7._8_8_ = 0;
      auVar1 = vmaxss_avx(ZEXT816(0) << 0x40,auVar7);
      auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar1);
      auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar1,ZEXT416(0x40400000));
      local_bc._0_4_ = auVar1._0_4_ * auVar1._0_4_ * auVar2._0_4_;
      glm::lerp<float,(glm::qualifier)0>
                (&local_78,(glm *)flightInitialViewR,
                 (tdualquat<float,_(glm::qualifier)0> *)flightTargetViewR,
                 (tdualquat<float,_(glm::qualifier)0> *)local_bc,in_R8);
      auVar6 = (undefined1  [56])0x0;
      vVar8 = glm::mix<3,float,float,(glm::qualifier)0>
                        ((vec<3,_float,_(glm::qualifier)0> *)&flightInitialViewT,
                         (vec<3,_float,_(glm::qualifier)0> *)&flightTargetViewT,
                         (float)local_bc._0_4_);
      local_b0 = vVar8.field_2;
      auVar5._0_8_ = vVar8._0_8_;
      auVar5._8_56_ = auVar6;
      local_bc._4_8_ = vmovlps_avx(auVar5._0_16_);
      glm::mat3x4_cast<float,(glm::qualifier)0>(&local_a8,(glm *)&local_78,x_00);
      buildTransform(&local_58,&local_a8,(vec3 *)(local_bc + 4));
      viewMat = local_58.value[0].field_0;
      viewMat_4 = local_58.value[0].field_1;
      DAT_0059f6dc = local_58.value[0].field_2;
      _DAT_0059f6e0 = local_58.value[0].field_3;
      uRam000000000059f6e4._0_4_ = local_58.value[1].field_0;
      DAT_0059f6e8 = local_58.value[1].field_1;
      DAT_0059f6ec = local_58.value[1].field_2;
      DAT_0059f6f0 = local_58.value[1].field_3;
      uRam000000000059f6f4._0_4_ = local_58.value[2].field_0;
      uRam000000000059f6f4._4_4_ = local_58.value[2].field_1;
      DAT_0059f6fc = local_58.value[2].field_2;
      _DAT_0059f700 = local_58.value[2].field_3;
      uRam000000000059f704._0_4_ = local_58.value[3].field_0;
      uRam000000000059f704._4_4_ = local_58.value[3].field_1;
      uRam000000000059f70c._0_4_ = local_58.value[3].field_2;
      DAT_0059f710 = local_58.value[3].field_3;
      auVar1 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * flightTargetFov)),
                               ZEXT416((uint)(1.0 - auVar7._0_4_)),ZEXT416(flightInitialFov));
      fVar3 = auVar1._0_4_;
    }
    else {
      midflight = '\0';
      glm::mat3x4_cast<float,(glm::qualifier)0>(&local_a8,(glm *)flightTargetViewR,x);
      buildTransform(&local_58,&local_a8,(vec3 *)&flightTargetViewT);
      viewMat = local_58.value[0].field_0;
      viewMat_4 = local_58.value[0].field_1;
      DAT_0059f6dc = local_58.value[0].field_2;
      _DAT_0059f6e0 = local_58.value[0].field_3;
      uRam000000000059f6e4._0_4_ = local_58.value[1].field_0;
      DAT_0059f6e8 = local_58.value[1].field_1;
      DAT_0059f6ec = local_58.value[1].field_2;
      DAT_0059f6f0 = local_58.value[1].field_3;
      uRam000000000059f6f4._0_4_ = local_58.value[2].field_0;
      uRam000000000059f6f4._4_4_ = local_58.value[2].field_1;
      DAT_0059f6fc = local_58.value[2].field_2;
      _DAT_0059f700 = local_58.value[2].field_3;
      uRam000000000059f704._0_4_ = local_58.value[3].field_0;
      uRam000000000059f704._4_4_ = local_58.value[3].field_1;
      uRam000000000059f70c._0_4_ = local_58.value[3].field_2;
      DAT_0059f710 = local_58.value[3].field_3;
      fVar3 = flightTargetFov;
    }
    fov = (double)fVar3;
    requestRedraw();
  }
  return;
}

Assistant:

void updateFlight() {
  if (midflight) {
    if (ImGui::GetTime() > flightEndTime) {
      // Flight is over, ensure we end exactly at target location
      midflight = false;
      viewMat = buildTransform(glm::mat3x4_cast(flightTargetViewR), flightTargetViewT);
      fov = flightTargetFov;
    } else {
      // normalized time for spline on [0,1]
      float t = (ImGui::GetTime() - flightStartTime) / (flightEndTime - flightStartTime);

      float tSmooth = glm::smoothstep(0.f, 1.f, t);

      // linear spline
      glm::dualquat interpR = glm::lerp(flightInitialViewR, flightTargetViewR, tSmooth);

      glm::vec3 interpT = glm::mix(flightInitialViewT, flightTargetViewT, tSmooth);

      viewMat = buildTransform(glm::mat3x4_cast(interpR), interpT);

      // linear spline
      fov = (1.0f - t) * flightInitialFov + t * flightTargetFov;
    }
    requestRedraw(); // flight is still happening, draw again next frame
  }
}